

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O1

void doitz(bool skipheader)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  FILE *pFVar5;
  FILE *pFVar6;
  size_t sVar7;
  undefined8 extraout_RAX;
  bool bVar8;
  char cVar9;
  char *___argv;
  undefined7 in_register_00000039;
  char *pcVar10;
  bool index_file;
  long lVar11;
  bool skipheader_00;
  VulnerabilityIndex idx;
  string sStack_110;
  string sStack_f0;
  FILE *pFStack_d0;
  uint uStack_98;
  uint uStack_94;
  float fStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  float fStack_80;
  undefined4 uStack_7c;
  FILE *pFStack_70;
  FILE *pFStack_68;
  int local_34;
  long local_30;
  longlong local_28;
  longlong local_20;
  
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("vulnerability_id,intensity_bin_id,damage_bin_id,probability");
  }
  pFVar5 = fopen("vulnerability.bin.z","rb");
  iVar4 = 0x102034;
  cVar9 = 'H';
  pFVar6 = fopen("vulnerability.idx.z","rb");
  if (pFVar6 != (FILE *)0x0) {
    sVar7 = fread(&local_34,0x1c,1,pFVar6);
    if (sVar7 != 0) {
      do {
        fseek(pFVar5,local_30,0);
        printrowsz(local_34,(FILE *)pFVar5,local_28,local_20);
        sVar7 = fread(&local_34,0x1c,1,pFVar6);
      } while (sVar7 != 0);
    }
    fclose(pFVar5);
    fclose(pFVar6);
    return;
  }
  doitz();
  pFStack_68 = pFVar5;
  if (iVar4 == 0) {
    puts("vulnerability_id,intensity_bin_id,damage_bin_id,probability");
  }
  if (cVar9 == '\0') {
    fread(&uStack_98,4,1,_stdin);
    sVar7 = fread(&uStack_8c,0x10,1,_stdin);
    if ((int)sVar7 != 0) {
      do {
        printf("%d, %d, %d, %.10e\n",(double)fStack_80,(ulong)uStack_8c,(ulong)uStack_88,
               (ulong)uStack_84);
        sVar7 = fread(&uStack_8c,0x10,1,_stdin);
      } while ((int)sVar7 != 0);
    }
  }
  else {
    pFVar6 = fopen("vulnerability.bin","rb");
    pcVar10 = "vulnerability.idx";
    ___argv = "rb";
    pFVar5 = fopen("vulnerability.idx","rb");
    if (pFVar5 == (FILE *)0x0) {
      doit();
      skipheader_00 = false;
      index_file = false;
      pFStack_d0 = pFVar6;
      bVar3 = false;
      while( true ) {
        while( true ) {
          do {
            bVar8 = bVar3;
            iVar4 = getopt((int)pcVar10,(char **)___argv,"vhsiz");
            bVar3 = true;
          } while (iVar4 == 0x7a);
          if (0x72 < iVar4) break;
          if (iVar4 == -1) {
            sStack_f0._M_dataplus._M_p = (pointer)&sStack_f0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_f0,"","");
            sStack_110._M_dataplus._M_p = (pointer)&sStack_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&sStack_110,"","");
            initstreams(&sStack_f0,&sStack_110);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_110._M_dataplus._M_p != &sStack_110.field_2) {
              operator_delete(sStack_110._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)sStack_f0._M_dataplus._M_p != &sStack_f0.field_2) {
              operator_delete(sStack_f0._M_dataplus._M_p);
            }
            if (bVar8) {
              doitz(skipheader_00);
            }
            else {
              doit(skipheader_00,index_file);
            }
            return;
          }
          if (iVar4 != 0x69) goto LAB_00101766;
          index_file = true;
          bVar3 = bVar8;
        }
        if (iVar4 != 0x73) break;
        skipheader_00 = true;
        bVar3 = bVar8;
      }
      if (iVar4 == 0x76) {
        main_cold_1();
      }
LAB_00101766:
      main_cold_2();
      if (sStack_110._M_dataplus._M_p != (pointer)((ulong)pcVar10 & 0xffffffff)) {
        operator_delete(sStack_110._M_dataplus._M_p);
      }
      if (sStack_f0._M_dataplus._M_p != "vhsiz") {
        operator_delete(sStack_f0._M_dataplus._M_p);
      }
      _Unwind_Resume(extraout_RAX);
    }
    sVar7 = fread(&uStack_8c,0x1c,1,pFVar5);
    if (sVar7 != 0) {
      pFStack_70 = pFVar5;
      do {
        fseek(pFVar6,CONCAT44(uStack_84,uStack_88),0);
        uVar2 = uStack_8c;
        lVar1 = CONCAT44(uStack_7c,fStack_80);
        if (0 < lVar1) {
          lVar11 = 0;
          do {
            fread(&uStack_98,0xc,1,pFVar6);
            printf("%d, %d, %d, %.10e\n",(double)fStack_90,(ulong)uVar2,(ulong)uStack_98,
                   (ulong)uStack_94);
            lVar11 = lVar11 + 0xc;
          } while (lVar11 < lVar1);
        }
        pFVar5 = pFStack_70;
        sVar7 = fread(&uStack_8c,0x1c,1,pFStack_70);
      } while (sVar7 != 0);
    }
    fclose(pFVar6);
    fclose(pFVar5);
  }
  return;
}

Assistant:

void doitz(bool skipheader)
{

	if (skipheader == false) {
		printf("vulnerability_id,intensity_bin_id,damage_bin_id,"
		       "probability\n");
	}

	const char *binFileName = "vulnerability.bin.z";
	const char *idxFileName = "vulnerability.idx.z";
	FILE *finx = fopen(binFileName, "rb");
	FILE *finy = fopen(idxFileName, "rb");
	if (finy == nullptr) {
		fprintf(stderr, "FATAL: Vulnerability idx open failed\n");
		exit(EXIT_FAILURE);
	}

	VulnerabilityIndex idx;

	size_t i = fread(&idx, sizeof(idx), 1, finy);
	while (i != 0) {
		flseek(finx, idx.offset, SEEK_SET);
		printrowsz(idx.vulnerability_id, finx, idx.size,
			   idx.original_size);
		i = fread(&idx, sizeof(idx), 1, finy);
	}

	fclose(finx);
	fclose(finy);

}